

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall solitaire::graphics::Renderer::renderTableauPile(Renderer *this,PileId *id)

{
  Context *pCVar1;
  TableauPileCollider *pileCollider_00;
  TableauPileCollider *pileCards_00;
  bool bVar2;
  int iVar3;
  uint topCoveredCardPosition;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PileId local_3c;
  TableauPileCollider *local_38;
  TableauPileCollider *pileCollider;
  Cards *pileCards;
  long *local_20;
  TableauPile *pile;
  PileId *id_local;
  Renderer *this_local;
  
  pile = (TableauPile *)id;
  id_local = (PileId *)this;
  iVar3 = (*this->context->_vptr_Context[5])();
  piles::PileId::PileId((PileId *)((long)&pileCards + 4),id);
  local_20 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x70))
                               ((long *)CONCAT44(extraout_var,iVar3),(long)&pileCards + 4);
  pileCollider = (TableauPileCollider *)(**(code **)(*local_20 + 0x38))();
  pCVar1 = this->context;
  piles::PileId::PileId(&local_3c,id);
  iVar3 = (*pCVar1->_vptr_Context[9])(pCVar1,&local_3c);
  local_38 = (TableauPileCollider *)CONCAT44(extraout_var_00,iVar3);
  bVar2 = std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::empty
                    ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
                     pileCollider);
  pileCards_00 = pileCollider;
  pileCollider_00 = local_38;
  if (!bVar2) {
    topCoveredCardPosition = (**(code **)(*local_20 + 0x40))();
    renderTableauPileWithCards(this,pileCollider_00,(Cards *)pileCards_00,topCoveredCardPosition);
  }
  return;
}

Assistant:

void Renderer::renderTableauPile(const PileId id) const {
    const auto& pile = context.getSolitaire().getTableauPile(id);
    const auto& pileCards = pile.getCards();
    const auto& pileCollider = context.getTableauPileCollider(id);

    if (not pileCards.empty())
        renderTableauPileWithCards(
            pileCollider,pileCards, pile.getTopCoveredCardPosition());
}